

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  uint uVar1;
  uint32_t uVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  pcVar3 = this->data_;
  pcVar5 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar3);
  uVar4 = (uint)pcVar5;
  this->current_ = uVar4;
  uVar1 = this->restarts_;
  if (uVar4 < uVar1) {
    pcVar3 = DecodeEntry(pcVar3 + ((ulong)pcVar5 & 0xffffffff),pcVar3 + uVar1,&local_24,&local_2c,
                         &local_28);
    if ((pcVar3 != (char *)0x0) && ((ulong)local_24 <= (this->key_)._M_string_length)) {
      std::__cxx11::string::resize((ulong)&this->key_);
      std::__cxx11::string::append((char *)&this->key_,(ulong)pcVar3);
      (this->value_).data_ = pcVar3 + local_2c;
      (this->value_).size_ = (ulong)local_28;
      uVar2 = this->restart_index_;
      while( true ) {
        if (this->num_restarts_ <= uVar2 + 1) {
          return true;
        }
        uVar2 = GetRestartPoint(this,uVar2 + 1);
        if (this->current_ <= uVar2) break;
        uVar2 = this->restart_index_ + 1;
        this->restart_index_ = uVar2;
      }
      return true;
    }
    CorruptionError(this);
  }
  else {
    this->current_ = uVar1;
    this->restart_index_ = this->num_restarts_;
  }
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }